

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_create_cumulative_image.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  LBDOperator *pLVar4;
  _InputArray *p_Var5;
  int local_350;
  vector<int,_std::allocator<int>_> local_348;
  _InputArray local_328;
  allocator local_309;
  string local_308 [32];
  _OutputArray local_2e8;
  Mat local_2d0 [8];
  Mat res8;
  stringstream local_270 [8];
  stringstream windowNameStr;
  _InputOutputArray local_e8;
  _InputArray local_d0;
  undefined1 local_a8 [8];
  Mat result;
  Size_<int> local_48;
  LBDOperator *local_40;
  LBDOperator *LBD;
  Size patchSize;
  int c;
  int optionIndex;
  int normalize;
  int M;
  int pside;
  int lbdType;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    print_usage(_stdout,argv);
  }
  else {
    M = 0;
    normalize = 0x20;
    optionIndex = 0x200;
    c = 0;
    patchSize.width = getopt_long(argc,argv,"i:m:n:p:",main::long_options,&patchSize.height);
    while (patchSize.width != -1) {
      if (patchSize.width == 0) {
        if (patchSize.height == 0) {
          iVar2 = strncmp(_optarg,"freak",5);
          if (iVar2 == 0) {
            M = 0;
          }
          else {
            iVar2 = strncmp(_optarg,"brief",5);
            if (iVar2 == 0) {
              M = 2;
            }
            else {
              iVar2 = strncmp(_optarg,"exfreak",7);
              if (iVar2 == 0) {
                M = 3;
              }
              else {
                M = 1;
              }
            }
          }
        }
      }
      else if (patchSize.width == 0x3f) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option: -");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,patchSize.width);
        std::operator<<(poVar3," (ignored)\n");
      }
      else if (patchSize.width == 0x6d) {
        iVar2 = atoi(_optarg);
        if (iVar2 < 2) {
          local_350 = 1;
        }
        else {
          local_350 = atoi(_optarg);
        }
        optionIndex = local_350;
      }
      else if (patchSize.width == 0x6e) {
        c = atoi(_optarg);
      }
      else if (patchSize.width == 0x70) {
        iVar2 = atoi(_optarg);
        normalize = iVar2 % 2 + iVar2;
      }
      patchSize.width = getopt_long(argc,argv,"m:n:p:",main::long_options,&patchSize.height);
    }
    cv::Size_<int>::Size_((Size_<int> *)&LBD,normalize,normalize);
    pLVar4 = lts2::CreateLbdOperator(M,optionIndex);
    local_40 = pLVar4;
    cv::Size_<int>::Size_(&local_48,(Size_<int> *)&LBD);
    (*(pLVar4->super_LinearOperator)._vptr_LinearOperator[5])(pLVar4,&local_48);
    cv::Mat::Mat((Mat *)local_a8);
    lts2::LBDOperator::drawSelfInImage(local_40,(Mat *)local_a8,c);
    cv::_InputArray::_InputArray(&local_d0,(Mat *)local_a8);
    cv::_InputOutputArray::_InputOutputArray(&local_e8,(Mat *)local_a8);
    p_Var5 = (_InputArray *)cv::noArray();
    cv::normalize(&local_d0,&local_e8,0.0,1.0,0x20,-1,p_Var5);
    cv::_InputOutputArray::~_InputOutputArray(&local_e8);
    cv::_InputArray::~_InputArray(&local_d0);
    std::__cxx11::stringstream::stringstream(local_270);
    cv::Mat::Mat(local_2d0);
    cv::_OutputArray::_OutputArray(&local_2e8,local_2d0);
    cv::Mat::convertTo((_OutputArray *)local_a8,(int)&local_2e8,255.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_2e8);
    pcVar1 = argv[argc + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,pcVar1,&local_309);
    cv::_InputArray::_InputArray(&local_328,local_2d0);
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_348);
    cv::imwrite(local_308,&local_328,(vector *)&local_348);
    std::vector<int,_std::allocator<int>_>::~vector(&local_348);
    cv::_InputArray::~_InputArray(&local_328);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    cv::Mat::~Mat(local_2d0);
    std::__cxx11::stringstream::~stringstream(local_270);
    cv::Mat::~Mat((Mat *)local_a8);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int M = 512;
  int normalize = 0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:m:n:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      break;
      
    case 'm':
      M = MAX(1, atoi(optarg));
      break;

    case 'n':
      normalize = atoi(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "m:n:p:", long_options, &optionIndex);
  }

  cv::Size patchSize(pside,pside);
  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType, M);
  LBD->initWithPatchSize(patchSize);

  cv::Mat result;
  LBD->drawSelfInImage(result, normalize);
  cv::normalize(result, result, 0.0, 1.0, cv::NORM_MINMAX);

  std::stringstream windowNameStr;

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}